

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

void __thiscall
cmLocalGenerator::WriteUnitySourceInclude
          (cmLocalGenerator *this,ostream *unity_file,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *cond,string *sf_full_path,cmValue beforeInclude,cmValue afterInclude,cmValue uniqueIdName
          )

{
  bool bVar1;
  ostream *poVar2;
  string *psVar3;
  long *plVar4;
  size_type *psVar5;
  string pathToHash;
  string path;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string *local_40;
  string *local_38;
  
  if ((cond->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    std::__ostream_insert<char,std::char_traits<char>>(unity_file,"#if ",4);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (unity_file,
                        (cond->
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        )._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_payload._M_value._M_dataplus._M_p,
                        (cond->
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        )._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_payload._M_value._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  }
  if ((uniqueIdName.Value == (string *)0x0) || ((uniqueIdName.Value)->_M_string_length == 0))
  goto LAB_00288241;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_a0._M_string_length = 0;
  local_a0.field_2._M_local_buf[0] = '\0';
  local_40 = beforeInclude.Value;
  local_38 = afterInclude.Value;
  cmsys::SystemTools::GetFilenamePath(&local_60,sf_full_path);
  psVar3 = cmake::GetHomeOutputDirectory_abi_cxx11_(this->GlobalGenerator->CMakeInstance);
  bVar1 = cmsys::SystemTools::ComparePath(&local_60,psVar3);
  if ((bVar1) || (bVar1 = cmsys::SystemTools::IsSubDirectory(&local_60,psVar3), bVar1)) {
    psVar3 = cmake::GetHomeOutputDirectory_abi_cxx11_(this->GlobalGenerator->CMakeInstance);
    cmSystemTools::RelativePath(&local_80,psVar3,sf_full_path);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,0x76932a);
LAB_00288064:
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_c0.field_2._M_allocated_capacity = *psVar5;
      local_c0.field_2._8_8_ = plVar4[3];
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    }
    else {
      local_c0.field_2._M_allocated_capacity = *psVar5;
      local_c0._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_c0._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
LAB_002880e3:
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    psVar3 = cmake::GetHomeDirectory_abi_cxx11_(this->GlobalGenerator->CMakeInstance);
    bVar1 = cmsys::SystemTools::ComparePath(&local_60,psVar3);
    if ((bVar1) || (bVar1 = cmsys::SystemTools::IsSubDirectory(&local_60,psVar3), bVar1)) {
      psVar3 = cmake::GetHomeDirectory_abi_cxx11_(this->GlobalGenerator->CMakeInstance);
      cmSystemTools::RelativePath(&local_80,psVar3,sf_full_path);
      plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,0x76932f);
      goto LAB_00288064;
    }
    std::operator+(&local_c0,"ABS_",sf_full_path);
    std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_c0);
    local_80.field_2._M_allocated_capacity = local_c0.field_2._M_allocated_capacity;
    local_80._M_dataplus._M_p = local_c0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) goto LAB_002880e3;
  }
  std::__ostream_insert<char,std::char_traits<char>>(unity_file,"/* ",3);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (unity_file,local_a0._M_dataplus._M_p,local_a0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," */\n",4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"#undef ",7);
  if (uniqueIdName.Value == (string *)0x0) {
    uniqueIdName.Value = &cmValue::Empty_abi_cxx11_;
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,((uniqueIdName.Value)->_M_dataplus)._M_p,
                      (uniqueIdName.Value)->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"#define ",8);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,((uniqueIdName.Value)->_M_dataplus)._M_p,
                      (uniqueIdName.Value)->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," unity_",7);
  cmSystemTools::ComputeStringMD5(&local_c0,&local_a0);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_c0._M_dataplus._M_p,local_c0._M_string_length);
  afterInclude.Value = local_38;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  beforeInclude.Value = local_40;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,
                    CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                             local_a0.field_2._M_local_buf[0]) + 1);
    beforeInclude.Value = local_40;
  }
LAB_00288241:
  if (beforeInclude.Value != (string *)0x0) {
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (unity_file,((beforeInclude.Value)->_M_dataplus)._M_p,
                        (beforeInclude.Value)->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(unity_file,"#include \"",10);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (unity_file,(sf_full_path->_M_dataplus)._M_p,sf_full_path->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"\n",2);
  if (afterInclude.Value != (string *)0x0) {
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (unity_file,((afterInclude.Value)->_M_dataplus)._M_p,
                        (afterInclude.Value)->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  }
  if ((cond->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    std::__ostream_insert<char,std::char_traits<char>>(unity_file,"#endif\n",7);
  }
  std::__ostream_insert<char,std::char_traits<char>>(unity_file,"\n",1);
  return;
}

Assistant:

void cmLocalGenerator::WriteUnitySourceInclude(
  std::ostream& unity_file, cm::optional<std::string> const& cond,
  std::string const& sf_full_path, cmValue beforeInclude, cmValue afterInclude,
  cmValue uniqueIdName) const
{
  if (cond) {
    unity_file << "#if " << *cond << "\n";
  }

  if (cmNonempty(uniqueIdName)) {
    std::string pathToHash;
    auto PathEqOrSubDir = [](std::string const& a, std::string const& b) {
      return (cmSystemTools::ComparePath(a, b) ||
              cmSystemTools::IsSubDirectory(a, b));
    };
    const auto path = cmSystemTools::GetFilenamePath(sf_full_path);
    if (PathEqOrSubDir(path, this->GetBinaryDirectory())) {
      pathToHash = "BLD_" +
        cmSystemTools::RelativePath(this->GetBinaryDirectory(), sf_full_path);
    } else if (PathEqOrSubDir(path, this->GetSourceDirectory())) {
      pathToHash = "SRC_" +
        cmSystemTools::RelativePath(this->GetSourceDirectory(), sf_full_path);
    } else {
      pathToHash = "ABS_" + sf_full_path;
    }
    unity_file << "/* " << pathToHash << " */\n"
               << "#undef " << *uniqueIdName << "\n"
               << "#define " << *uniqueIdName << " unity_"
#ifndef CMAKE_BOOTSTRAP
               << cmSystemTools::ComputeStringMD5(pathToHash) << "\n"
#endif
      ;
  }

  if (beforeInclude) {
    unity_file << *beforeInclude << "\n";
  }

  unity_file << "#include \"" << sf_full_path << "\"\n";

  if (afterInclude) {
    unity_file << *afterInclude << "\n";
  }
  if (cond) {
    unity_file << "#endif\n";
  }
  unity_file << "\n";
}